

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O0

void __thiscall FNotifyBuffer::AddString(FNotifyBuffer *this,int printlevel,FString *source)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  FNotifyText *pFVar7;
  size_t sVar8;
  float fVar9;
  undefined1 local_58 [8];
  FNotifyText newline;
  FString local_38;
  FString str;
  int width;
  int i;
  FBrokenLines *lines;
  FString *source_local;
  int printlevel_local;
  FNotifyBuffer *this_local;
  
  if ((printlevel != 0x80) && (bVar2 = FBoolCVar::operator_cast_to_bool(&show_messages), !bVar2)) {
    return;
  }
  bVar2 = FString::IsEmpty(source);
  if (bVar2) {
    return;
  }
  if (gamestate == GS_FULLCONSOLE) {
    return;
  }
  if (gamestate == GS_DEMOSCREEN) {
    return;
  }
  iVar3 = FIntCVar::operator_cast_to_int(&con_notifylines);
  if (iVar3 == 0) {
    return;
  }
  if ((ConsoleDrawing & 1U) != 0) {
    pcVar6 = FString::operator_cast_to_char_(source);
    EnqueueConsoleText(true,printlevel,pcVar6);
    return;
  }
  iVar4 = active_con_scaletext();
  iVar1 = DisplayWidth;
  iVar3 = CleanXfac;
  if (iVar4 != 0) {
    iVar3 = active_con_scaletext();
  }
  str.Chars._0_4_ = iVar1 / iVar3;
  if ((this->AddType == APPENDLINE) &&
     (uVar5 = TArray<FNotifyText,_FNotifyText>::Size(&this->Text), uVar5 != 0)) {
    uVar5 = TArray<FNotifyText,_FNotifyText>::Size(&this->Text);
    pFVar7 = TArray<FNotifyText,_FNotifyText>::operator[](&this->Text,(ulong)(uVar5 - 1));
    if (pFVar7->PrintLevel == printlevel) {
      uVar5 = TArray<FNotifyText,_FNotifyText>::Size(&this->Text);
      pFVar7 = TArray<FNotifyText,_FNotifyText>::operator[](&this->Text,(ulong)(uVar5 - 1));
      FString::operator+(&local_38,&pFVar7->Text);
      _width = V_BreakLines(SmallFont,(int)str.Chars,&local_38,false);
      FString::~FString(&local_38);
      goto LAB_0043f573;
    }
  }
  _width = V_BreakLines(SmallFont,(int)str.Chars,source,false);
  if (this->AddType == APPENDLINE) {
    this->AddType = NEWLINE;
  }
LAB_0043f573:
  if (_width != (FBrokenLines *)0x0) {
    str.Chars._4_4_ = 0;
    while (-1 < _width[str.Chars._4_4_].Width) {
      FNotifyText::FNotifyText((FNotifyText *)local_58);
      FString::operator=((FString *)&newline,&_width[str.Chars._4_4_].Text);
      iVar3 = gametic;
      fVar9 = FFloatCVar::operator_cast_to_float(&con_notifytime);
      local_58._0_4_ = iVar3 + (int)(fVar9 * 35.0);
      local_58._4_4_ = printlevel;
      if ((this->AddType == NEWLINE) ||
         (uVar5 = TArray<FNotifyText,_FNotifyText>::Size(&this->Text), uVar5 == 0)) {
        iVar3 = FIntCVar::operator_cast_to_int(&con_notifylines);
        if (0 < iVar3) {
          iVar3 = FIntCVar::operator_cast_to_int(&con_notifylines);
          Shift(this,iVar3 + -1);
        }
        TArray<FNotifyText,_FNotifyText>::Push(&this->Text,(FNotifyText *)local_58);
      }
      else {
        uVar5 = TArray<FNotifyText,_FNotifyText>::Size(&this->Text);
        pFVar7 = TArray<FNotifyText,_FNotifyText>::operator[](&this->Text,(ulong)(uVar5 - 1));
        FNotifyText::operator=(pFVar7,(FNotifyText *)local_58);
      }
      this->AddType = NEWLINE;
      FNotifyText::~FNotifyText((FNotifyText *)local_58);
      str.Chars._4_4_ = str.Chars._4_4_ + 1;
    }
    V_FreeBrokenLines(_width);
    sVar8 = FString::Len(source);
    pcVar6 = FString::operator[](source,sVar8 - 1);
    if (*pcVar6 == '\n') {
      this->AddType = NEWLINE;
    }
    else if (*pcVar6 == '\r') {
      this->AddType = REPLACELINE;
    }
    else {
      this->AddType = APPENDLINE;
    }
    this->TopGoal = 0;
  }
  return;
}

Assistant:

void FNotifyBuffer::AddString(int printlevel, FString source)
{
	FBrokenLines *lines;
	int i, width;

	if ((printlevel != 128 && !show_messages) ||
		source.IsEmpty() ||
		gamestate == GS_FULLCONSOLE ||
		gamestate == GS_DEMOSCREEN ||
		con_notifylines == 0)
		return;

	if (ConsoleDrawing)
	{
		EnqueueConsoleText (true, printlevel, source);
		return;
	}

	if (active_con_scaletext() == 0)
	{
		width = DisplayWidth / CleanXfac;
	}
	else
	{
		width = DisplayWidth / active_con_scaletext();
	}

	if (AddType == APPENDLINE && Text.Size() > 0 && Text[Text.Size() - 1].PrintLevel == printlevel)
	{
		FString str = Text[Text.Size() - 1].Text + source;
		lines = V_BreakLines (SmallFont, width, str);
	}
	else
	{
		lines = V_BreakLines (SmallFont, width, source);
		if (AddType == APPENDLINE)
		{
			AddType = NEWLINE;
		}
	}

	if (lines == NULL)
		return;

	for (i = 0; lines[i].Width >= 0; i++)
	{
		FNotifyText newline;

		newline.Text = lines[i].Text;
		newline.TimeOut = gametic + int(con_notifytime * TICRATE);
		newline.PrintLevel = printlevel;
		if (AddType == NEWLINE || Text.Size() == 0)
		{
			if (con_notifylines > 0)
			{
				Shift(con_notifylines - 1);
			}
			Text.Push(newline);
		}
		else
		{
			Text[Text.Size() - 1] = newline;
		}
		AddType = NEWLINE;
	}

	V_FreeBrokenLines (lines);
	lines = NULL;

	switch (source[source.Len()-1])
	{
	case '\r':	AddType = REPLACELINE;	break;
	case '\n':	AddType = NEWLINE;		break;
	default:	AddType = APPENDLINE;	break;
	}

	TopGoal = 0;
}